

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

void __thiscall Process::fileOutPut(Process *this,vector<int,_std::allocator<int>_> *distribution)

{
  ostream *poVar1;
  int i;
  long lVar2;
  double dVar3;
  ofstream LayerOutput;
  
  std::ofstream::ofstream(&LayerOutput,"../Results/Distibution.txt",_S_out);
  for (lVar2 = 0; dVar3 = (double)(int)lVar2 * this->tau, dVar3 < (double)this->T; lVar2 = lVar2 + 1
      ) {
    poVar1 = std::ostream::_M_insert<double>(dVar3);
    poVar1 = std::operator<<(poVar1,"\t\t");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,(distribution->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                               .super__Vector_impl_data._M_start[lVar2]);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::ofstream::~ofstream(&LayerOutput);
  return;
}

Assistant:

void Process::fileOutPut(std::vector<int> distribution){
    std::ofstream LayerOutput("../Results/Distibution.txt");
            for (int i = 0; i*tau < T; i++) {
                LayerOutput << i * tau << "\t\t" << distribution[i] << std::endl;
            }

}